

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelDefines::IfcRelDefines(IfcRelDefines *this,void **vtt)

{
  void **vtt_local;
  IfcRelDefines *this_local;
  
  IfcRelationship::IfcRelationship((IfcRelationship *)this,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>,vtt + 10);
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0xc];
  *(void **)&this->field_0x88 = vtt[0xd];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0xe];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObject>,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObject>,_1UL,_0UL> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).field_0x10);
  return;
}

Assistant:

IfcRelDefines() : Object("IfcRelDefines") {}